

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

void Llb_Nonlin4AddPartition(Llb_Mgr_t_conflict *p,int i,DdNode *bFunc)

{
  int iVar1;
  Llb_Prt_t *pLVar2;
  Vec_Int_t *pVVar3;
  int local_28;
  int local_24;
  int nSuppSize;
  int k;
  DdNode *bFunc_local;
  int i_local;
  Llb_Mgr_t_conflict *p_local;
  
  if (*(int *)((ulong)bFunc & 0xfffffffffffffffe) != 0x7fffffff) {
    pLVar2 = (Llb_Prt_t *)calloc(1,0x18);
    p->pParts[i] = pLVar2;
    p->pParts[i]->iPart = i;
    p->pParts[i]->bFunc = bFunc;
    Cudd_Ref(bFunc);
    pVVar3 = Vec_IntAlloc(8);
    p->pParts[i]->vVars = pVVar3;
    local_28 = 0;
    Extra_SupportArray(p->dd,bFunc,p->pSupp);
    for (local_24 = 0; local_24 < p->nVars; local_24 = local_24 + 1) {
      local_28 = p->pSupp[local_24] + local_28;
      if (p->pSupp[local_24] != 0) {
        iVar1 = Vec_IntEntry(p->vVars2Q,local_24);
        if (iVar1 != 0) {
          Llb_Nonlin4AddPair(p,i,local_24);
        }
      }
    }
    iVar1 = Abc_MaxInt(p->nSuppMax,local_28);
    p->nSuppMax = iVar1;
    return;
  }
  __assert_fail("!Cudd_IsConstant(bFunc)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Image.c"
                ,0x219,"void Llb_Nonlin4AddPartition(Llb_Mgr_t *, int, DdNode *)");
}

Assistant:

void Llb_Nonlin4AddPartition( Llb_Mgr_t * p, int i, DdNode * bFunc )
{
    int k, nSuppSize;
    assert( !Cudd_IsConstant(bFunc) );
//printf( "Creating init %d\n", i );
    // create partition
    p->pParts[i] = ABC_CALLOC( Llb_Prt_t, 1 );
    p->pParts[i]->iPart = i;
    p->pParts[i]->bFunc = bFunc;  Cudd_Ref( bFunc );
    p->pParts[i]->vVars = Vec_IntAlloc( 8 );
    // add support dependencies
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( k = 0; k < p->nVars; k++ )
    {
        nSuppSize += p->pSupp[k];
        if ( p->pSupp[k] && Vec_IntEntry(p->vVars2Q, k) )
            Llb_Nonlin4AddPair( p, i, k );
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
}